

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O1

parse_buffer * buffer_skip_whitespace(parse_buffer *buffer)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (buffer != (parse_buffer *)0x0) {
    if (buffer->content != (uchar *)0x0) {
      uVar1 = buffer->length;
      uVar2 = buffer->offset;
      uVar3 = uVar2;
      if (uVar2 < uVar1) {
        do {
          uVar3 = uVar2;
          if (0x20 < buffer->content[uVar2]) break;
          uVar2 = uVar2 + 1;
          buffer->offset = uVar2;
          uVar3 = uVar1;
        } while (uVar1 != uVar2);
      }
      if (uVar3 != uVar1) {
        return buffer;
      }
      buffer->offset = uVar3 - 1;
      return buffer;
    }
  }
  return (parse_buffer *)0x0;
}

Assistant:

static parse_buffer *buffer_skip_whitespace(parse_buffer * const buffer)
{
    if ((buffer == NULL) || (buffer->content == NULL))
    {
        return NULL;
    }

    while (can_access_at_index(buffer, 0) && (buffer_at_offset(buffer)[0] <= 32))
    {
       buffer->offset++;
    }

    if (buffer->offset == buffer->length)
    {
        buffer->offset--;
    }

    return buffer;
}